

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O3

bool __thiscall SocketServer::commonListen(SocketServer *this)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  _Any_data *args;
  SharedPtr loop;
  Error local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  EventLoop *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  iVar2 = ::listen(this->fd,0x80);
  if (iVar2 < 0) {
    commonListen(this);
    bVar3 = false;
  }
  else {
    EventLoop::eventLoop();
    bVar3 = true;
    if (local_30 != (EventLoop *)0x0) {
      iVar2 = this->fd;
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = operator_new(0x18);
      *(code **)local_50._M_unused._0_8_ = socketCallback;
      (((SocketServer *)local_50._M_unused._0_8_)->path).super_String.mString._M_dataplus._M_p =
           (pointer)0x0;
      (((SocketServer *)local_50._M_unused._0_8_)->path).super_String.mString._M_string_length =
           (size_type)this;
      local_38 = std::
                 _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketServer::*(SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketServer::*(SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                 ::_M_manager;
      EventLoop::registerSocket(local_30,iVar2,1,(function<void_(int,_unsigned_int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      bVar1 = SocketClient::setFlags(this->fd,0x800,3,4,FlagAppend);
      if (!bVar1) {
        args = &local_50;
        local_54 = InitializeError;
        local_50._M_unused._M_object = this;
        Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
                  (&this->serverError,(SocketServer **)args,&local_54);
        close(this,(int)args);
        bVar3 = false;
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return bVar3;
}

Assistant:

bool SocketServer::commonListen()
{
    // ### should be able to customize the backlog
    enum { Backlog = 128 };
    if (::listen(fd, Backlog) < 0) {
        fprintf(stderr, "::listen() failed with errno: %s\n",
                Rct::strerror().constData());

        serverError(this, ListenError);
        close();
        return false;
    }

    if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
        loop->registerSocket(fd, EventLoop::SocketRead,
                             //|EventLoop::SocketWrite,
                             std::bind(&SocketServer::socketCallback,
                                       this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#ifndef _WIN32
        if (!SocketClient::setFlags(fd, O_NONBLOCK, F_GETFL, F_SETFL)) {
            serverError(this, InitializeError);
            close();
            return false;
        }
#endif
    }

    return true;
}